

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::FuncDecl> __thiscall
mocker::Parser::funcDecl(Parser *this,TokIter *iter,TokIter end)

{
  Token *pTVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  TokenID TVar5;
  ASTNode *this_00;
  mapped_type *pmVar6;
  element_type *this_01;
  pointer this_02;
  element_type *this_03;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  shared_ptr<mocker::ast::FuncDecl> sVar8;
  Position beg_00;
  Position beg_01;
  Position end_00;
  Position end_01;
  NodeID local_1f0;
  size_t local_1e8;
  shared_ptr<mocker::ast::Type> *psStack_1e0;
  pair<mocker::Position,_mocker::Position> local_1d8;
  size_t local_1b8;
  size_t sStack_1b0;
  undefined1 local_198 [8];
  shared_ptr<mocker::ast::CompoundStmt> body;
  NodeID local_180;
  size_t local_178;
  shared_ptr<mocker::ast::Type> *psStack_170;
  NodeID local_160;
  size_t local_158;
  size_t sStack_150;
  Parser local_148;
  undefined1 local_130 [8];
  shared_ptr<mocker::ast::Identifier> paramName;
  undefined1 local_118 [8];
  shared_ptr<mocker::ast::Type> ty;
  undefined1 local_100 [8];
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  formalParam;
  undefined1 local_e0 [8];
  shared_ptr<mocker::ast::Identifier> ident;
  undefined1 local_b8 [8];
  shared_ptr<mocker::ast::Type> retType;
  Parser local_90;
  Token *local_70;
  undefined1 local_60 [24];
  anon_class_16_2_20bdb18b throwError;
  GetTokenID local_38;
  GetTokenID id;
  TokIter beg;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  id.end._M_current = *(TokIter *)end._M_current;
  GetTokenID::GetTokenID(&local_38,in_RCX);
  local_60._16_8_ = id.end._M_current;
  throwError.beg._M_current = end._M_current;
  type((Parser *)local_60,iter,end);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
  bVar4 = false;
  if (!bVar2) {
    local_70 = (Token *)__gnu_cxx::
                        __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                        ::operator++(end._M_current,0);
    TVar5 = GetTokenID::operator()(&local_38,(TokIter)local_70);
    bVar2 = true;
    if (TVar5 != Void) goto LAB_00258c61;
  }
  identifier(&local_90,iter,end);
  bVar4 = true;
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_90);
  bVar2 = true;
  if (bVar3) {
    retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
         ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                       *)end._M_current,0);
    TVar5 = GetTokenID::operator()
                      (&local_38,
                       (TokIter)retType.
                                super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi);
    bVar2 = TVar5 != LeftParen;
  }
LAB_00258c61:
  if (bVar4) {
    std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
              ((shared_ptr<mocker::ast::Identifier> *)&local_90);
  }
  std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_60);
  if (bVar2) {
    *(TokIter *)end._M_current = id.end._M_current;
    std::shared_ptr<mocker::ast::FuncDecl>::shared_ptr
              ((shared_ptr<mocker::ast::FuncDecl> *)this,(nullptr_t)0x0);
    _Var7._M_pi = extraout_RDX;
  }
  else {
    *(TokIter *)end._M_current = id.end._M_current;
    type((Parser *)local_b8,iter,end);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8);
    if (!bVar4) {
      TVar5 = GetTokenID::operator()(&local_38,*end._M_current);
      if (TVar5 != Void) {
        __assert_fail("id(iter) == TokenID::Void",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0x285,
                      "std::shared_ptr<ast::FuncDecl> mocker::Parser::funcDecl(TokIter &, TokIter)")
        ;
      }
      ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              __gnu_cxx::
              __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
              ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                            *)end._M_current,0);
    }
    identifier((Parser *)local_e0,iter,end);
    std::
    vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ::vector((vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
              *)local_100);
    ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
         ::operator+((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                      *)end._M_current,1);
    TVar5 = GetTokenID::operator()
                      (&local_38,
                       (TokIter)ty.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi);
    if (TVar5 == RightParen) {
      __gnu_cxx::
      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
      ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                    *)end._M_current);
    }
    else {
      do {
        __gnu_cxx::
        __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
        ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                      *)end._M_current);
        type((Parser *)local_118,iter,end);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_118);
        if (!bVar4) {
          funcDecl::anon_class_16_2_20bdb18b::operator()
                    ((anon_class_16_2_20bdb18b *)(local_60 + 0x10));
        }
        identifier((Parser *)local_130,iter,end);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_e0);
        if (!bVar4) {
          funcDecl::anon_class_16_2_20bdb18b::operator()
                    ((anon_class_16_2_20bdb18b *)(local_60 + 0x10));
        }
        pTVar1 = iter[2]._M_current;
        this_00 = &std::
                   __shared_ptr_access<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_118)->super_ASTNode;
        local_160 = ast::ASTNode::getID(this_00);
        pmVar6 = std::
                 unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                 ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                               *)pTVar1,&local_160);
        local_158 = (pmVar6->first).line;
        sStack_150 = (pmVar6->first).col;
        pTVar1 = iter[2]._M_current;
        this_01 = std::
                  __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_130);
        local_180 = ast::ASTNode::getID(&this_01->super_ASTNode);
        pmVar6 = std::
                 unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                 ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                               *)pTVar1,&local_180);
        local_178 = (pmVar6->second).line;
        psStack_170 = (shared_ptr<mocker::ast::Type> *)(pmVar6->second).col;
        beg_00.col = local_158;
        beg_00.line = (size_t)iter;
        end_00.col = local_178;
        end_00.line = sStack_150;
        makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>>
                  (&local_148,beg_00,end_00,psStack_170,
                   (shared_ptr<mocker::ast::Identifier> *)local_118);
        std::
        vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
        ::emplace_back<std::shared_ptr<mocker::ast::VarDeclStmt>>
                  ((vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
                    *)local_100,(shared_ptr<mocker::ast::VarDeclStmt> *)&local_148);
        std::shared_ptr<mocker::ast::VarDeclStmt>::~shared_ptr
                  ((shared_ptr<mocker::ast::VarDeclStmt> *)&local_148);
        std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
                  ((shared_ptr<mocker::ast::Identifier> *)local_130);
        std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_118);
        body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)end._M_current;
        TVar5 = GetTokenID::operator()
                          (&local_38,
                           (TokIter)body.
                                    super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi);
      } while (TVar5 == Comma);
    }
    __gnu_cxx::
    __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
    ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  *)end._M_current);
    compoundStmt((Parser *)local_198,iter,end);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_198);
    if (!bVar4) {
      funcDecl::anon_class_16_2_20bdb18b::operator()((anon_class_16_2_20bdb18b *)(local_60 + 0x10));
    }
    this_02 = __gnu_cxx::
              __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
              ::operator->(&id.end);
    Token::position(&local_1d8,this_02);
    local_1b8 = local_1d8.first.line;
    sStack_1b0 = local_1d8.first.col;
    pTVar1 = iter[2]._M_current;
    this_03 = std::
              __shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_198);
    local_1f0 = ast::ASTNode::getID((ASTNode *)this_03);
    pmVar6 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                           *)pTVar1,&local_1f0);
    local_1e8 = (pmVar6->second).line;
    psStack_1e0 = (shared_ptr<mocker::ast::Type> *)(pmVar6->second).col;
    beg_01.col = local_1b8;
    beg_01.line = (size_t)iter;
    end_01.col = local_1e8;
    end_01.line = sStack_1b0;
    makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
              (this,beg_01,end_01,psStack_1e0,(shared_ptr<mocker::ast::Identifier> *)local_b8,
               (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                *)local_e0,(shared_ptr<mocker::ast::CompoundStmt> *)local_100);
    std::shared_ptr<mocker::ast::CompoundStmt>::~shared_ptr
              ((shared_ptr<mocker::ast::CompoundStmt> *)local_198);
    std::
    vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ::~vector((vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
               *)local_100);
    std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
              ((shared_ptr<mocker::ast::Identifier> *)local_e0);
    std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_b8);
    _Var7._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::FuncDecl>)
         sVar8.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::FuncDecl> Parser::funcDecl(TokIter &iter, TokIter end) {
  auto beg = iter;
  auto id = GetTokenID(end);
  auto throwError = [beg, &iter] {
    throw SyntaxError(beg->position().first, iter->position().second);
  };

  if (!(type(iter, end) || id(iter++) == TokenID::Void) ||
      !identifier(iter, end) || id(iter++) != TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;
  auto retType = type(iter, end);
  if (!retType) {
    assert(id(iter) == TokenID::Void);
    iter++;
  }
  auto ident = identifier(iter, end);

  std::vector<std::shared_ptr<ast::VarDeclStmt>> formalParam;
  if (id(iter + 1) != TokenID::RightParen) {
    do {
      // Now [iter] points to a Comma or a LeftParen
      ++iter;
      auto ty = type(iter, end);
      if (!ty)
        throwError();
      auto paramName = identifier(iter, end);
      if (!ident)
        throwError();
      formalParam.emplace_back(makeNode<ast::VarDeclStmt>(
          pos[ty->getID()].first, pos[paramName->getID()].second, std::move(ty),
          std::move(paramName)));
    } while (id(iter) == TokenID::Comma);
  } else {
    ++iter;
  }
  ++iter;
  auto body = compoundStmt(iter, end);
  if (!body)
    throwError();
  return makeNode<ast::FuncDecl>(beg->position().first,
                                 pos[body->getID()].second, retType, ident,
                                 std::move(formalParam), body);
}